

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O0

apx_error_t
apx_program_encode_header
          (apx_program_t *program,apx_programType_t program_type,uint32_t element_size,
          uint32_t queue_size,_Bool is_dynamic)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  uint uVar3;
  ulong uVar4;
  bool is_queued_00;
  uint local_60;
  uint8_t local_5c;
  uint8_t local_58;
  uint8_t instruction;
  uint8_t variant;
  uint8_t opcode;
  uint64_t tmp;
  uint32_t queue_length_size;
  _Bool is_queued;
  uint8_t *p;
  uint8_t program_byte;
  uint8_t element_variant;
  uint8_t queue_variant;
  uint32_t data_size;
  uint32_t packed_size;
  undefined1 uStack_24;
  uint8_t data_size_variant;
  uint8_t encoded_size [4];
  adt_error_t rc;
  _Bool is_dynamic_local;
  uint32_t queue_size_local;
  uint32_t element_size_local;
  apx_programType_t program_type_local;
  apx_program_t *program_local;
  
  packed_size._2_1_ = 0;
  packed_size._3_1_ = is_dynamic;
  _uStack_24 = queue_size;
  unique0x10000329 = element_size;
  memset((void *)((long)&data_size + 2),0,4);
  p._3_1_ = '\0';
  p._2_1_ = '\0';
  puVar1 = (uint8_t *)((long)&data_size + 2);
  is_queued_00 = _uStack_24 != 0;
  if (is_queued_00) {
    if (_uStack_24 < 0x100) {
      local_58 = '\0';
    }
    else {
      local_58 = '\x02';
      if (_uStack_24 < 0x10000) {
        local_58 = '\x01';
      }
    }
    p._3_1_ = local_58;
    if (stack0xffffffffffffffe0 < 0x100) {
      local_5c = '\0';
    }
    else {
      local_5c = '\x02';
      if (stack0xffffffffffffffe0 < 0x10000) {
        local_5c = '\x01';
      }
    }
    p._2_1_ = local_5c;
    if (local_58 == '\0') {
      local_60 = 1;
    }
    else {
      local_60 = 4;
      if (local_58 == '\x01') {
        local_60 = 2;
      }
    }
    uVar4 = (ulong)local_60 + (ulong)stack0xffffffffffffffe0 * (ulong)_uStack_24;
    if (0xffffffff < uVar4) {
      return 7;
    }
    p._4_4_ = (uint)uVar4;
  }
  else {
    p._4_4_ = stack0xffffffffffffffe0;
  }
  if (p._4_4_ < 0x100) {
    data_size._1_1_ = '\0';
    packLE(puVar1,p._4_4_,'\x01');
    queue_length_size = (int)&data_size + 3;
  }
  else if (p._4_4_ < 0x10000) {
    data_size._1_1_ = '\x01';
    packLE(puVar1,p._4_4_,'\x02');
    queue_length_size = (uint32_t)&packed_size;
  }
  else {
    data_size._1_1_ = '\x02';
    packLE(puVar1,p._4_4_,'\x04');
    queue_length_size = (int)&packed_size + 2;
  }
  uVar3 = queue_length_size - ((int)&data_size + 2);
  if ((uVar3 == 0) || (4 < uVar3)) {
    __assert_fail("(packed_size > 0) && (packed_size <= UINT32_SIZE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/program.c"
                  ,0x62,
                  "apx_error_t apx_program_encode_header(apx_program_t *, apx_programType_t, uint32_t, uint32_t, _Bool)"
                 );
  }
  uVar2 = encode_program_byte(program_type,(_Bool)(packed_size._3_1_ & 1),is_queued_00,
                              data_size._1_1_);
  packed_size._2_1_ = adt_bytearray_push(program,uVar2);
  if (packed_size._2_1_ == '\0') {
    packed_size._2_1_ = adt_bytearray_append(program,(uint8_t *)((long)&data_size + 2),uVar3);
  }
  if ((packed_size._2_1_ == '\0') && (is_queued_00)) {
    uVar2 = calc_data_size_variant(p._2_1_,p._3_1_);
    uVar2 = apx_program_encode_instruction('\x02',uVar2,false);
    packed_size._2_1_ = adt_bytearray_push(program,uVar2);
    if (packed_size._2_1_ == '\0') {
      puVar1 = (uint8_t *)((long)&data_size + 2);
      if (p._2_1_ == '\0') {
        packLE(puVar1,stack0xffffffffffffffe0,'\x01');
        queue_length_size = (int)&data_size + 3;
      }
      else if (p._2_1_ == '\x01') {
        packLE(puVar1,stack0xffffffffffffffe0,'\x02');
        queue_length_size = (uint32_t)&packed_size;
      }
      else {
        if (p._2_1_ != '\x02') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/program.c"
                        ,0x82,
                        "apx_error_t apx_program_encode_header(apx_program_t *, apx_programType_t, uint32_t, uint32_t, _Bool)"
                       );
        }
        packLE(puVar1,stack0xffffffffffffffe0,'\x04');
        queue_length_size = (int)&packed_size + 2;
      }
      uVar3 = queue_length_size - ((int)&data_size + 2);
      if ((uVar3 == 0) || (4 < uVar3)) {
        __assert_fail("(packed_size > 0) && (packed_size <= UINT32_SIZE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/program.c"
                      ,0x86,
                      "apx_error_t apx_program_encode_header(apx_program_t *, apx_programType_t, uint32_t, uint32_t, _Bool)"
                     );
      }
      packed_size._2_1_ = adt_bytearray_append(program,(uint8_t *)((long)&data_size + 2),uVar3);
    }
  }
  if (packed_size._2_1_ == '\0') {
    program_local._4_4_ = 0;
  }
  else if (packed_size._2_1_ == '\x02') {
    program_local._4_4_ = 2;
  }
  else {
    program_local._4_4_ = 6;
  }
  return program_local._4_4_;
}

Assistant:

apx_error_t apx_program_encode_header(apx_program_t* program, apx_programType_t program_type, uint32_t element_size, uint32_t queue_size, bool is_dynamic)
{
   adt_error_t rc = ADT_NO_ERROR;
   uint8_t encoded_size[APX_VM_UINT32_SIZE] = { 0u, 0u, 0u, 0u };
   uint8_t data_size_variant = 0u;
   uint32_t packed_size = 0u;
   uint32_t data_size = 0u;
   uint8_t queue_variant = 0u; //Only used when is_queued is true
   uint8_t element_variant = 0u; //Only used when is_queued is true
   uint8_t program_byte = 0u;
   uint8_t* p = &encoded_size[0];
   bool const is_queued = queue_size > 0u;

   if (is_queued)
   {
      queue_variant = (queue_size <= UINT8_MAX) ? APX_VM_VARIANT_UINT8 : (queue_size <= UINT16_MAX) ? APX_VM_VARIANT_UINT16 : APX_VM_VARIANT_UINT32;
      element_variant = (element_size <= UINT8_MAX) ? APX_VM_VARIANT_UINT8 : (element_size <= UINT16_MAX) ? APX_VM_VARIANT_UINT16 : APX_VM_VARIANT_UINT32;
      uint32_t const queue_length_size = (queue_variant == APX_VM_VARIANT_UINT8) ? UINT8_SIZE : (queue_variant == APX_VM_VARIANT_UINT16) ? UINT16_SIZE : UINT32_SIZE;
      uint64_t const tmp = queue_length_size + (((uint64_t)element_size) * queue_size);
      if (tmp > UINT32_MAX)
      {
         return APX_LENGTH_ERROR;
      }
      data_size = (uint32_t)tmp;
   }
   else
   {
      data_size = element_size;
   }

   //determine value of data_size_variant
   if (data_size <= UINT8_MAX)
   {
      data_size_variant = APX_VM_VARIANT_UINT8;
      packLE(p, data_size, (uint8_t)UINT8_SIZE);
      p += UINT8_SIZE;
   }
   else if (data_size <= UINT16_MAX)
   {
      data_size_variant = APX_VM_VARIANT_UINT16;
      packLE(p, data_size, (uint8_t)UINT16_SIZE);
      p += UINT16_SIZE;
   }
   else
   {
      data_size_variant = APX_VM_VARIANT_UINT32;
      packLE(p, data_size, (uint8_t)UINT32_SIZE);
      p += UINT32_SIZE;
   }
   packed_size = (uint32_t)(p - &encoded_size[0]);
   assert((packed_size > 0) && (packed_size <= UINT32_SIZE));

   program_byte = encode_program_byte(program_type, is_dynamic, is_queued, data_size_variant);
   rc = adt_bytearray_push(program, program_byte);
   if (rc == ADT_NO_ERROR)
   {
      rc = adt_bytearray_append(program, &encoded_size[0], packed_size);
   }
   if ((rc == ADT_NO_ERROR) && is_queued)
   {
      uint8_t const opcode = APX_VM_OPCODE_DATA_SIZE;
      uint8_t const variant = calc_data_size_variant(element_variant, queue_variant);
      uint8_t const instruction = apx_program_encode_instruction(opcode, variant, false);
      rc = adt_bytearray_push(program, instruction);
      if (rc == ADT_NO_ERROR)
      {
         p = &encoded_size[0];
         switch (element_variant)
         {
         case APX_VM_VARIANT_UINT8:
            packLE(p, element_size, (uint8_t)UINT8_SIZE);
            p += UINT8_SIZE;
            break;
         case APX_VM_VARIANT_UINT16:
            packLE(p, element_size, (uint8_t)UINT16_SIZE);
            p += UINT16_SIZE;
            break;
         case APX_VM_VARIANT_UINT32:
            packLE(p, element_size, (uint8_t)UINT32_SIZE);
            p += UINT32_SIZE;
            break;
         default:
            assert(0);
            return APX_VALUE_TYPE_ERROR;
         }
         packed_size = (uint32_t)(p - &encoded_size[0]);
         assert((packed_size > 0) && (packed_size <= UINT32_SIZE));
         rc = adt_bytearray_append(program, &encoded_size[0], packed_size);
      }
   }

   if (rc != ADT_NO_ERROR)
   {
      if (rc == ADT_MEM_ERROR)
      {
         return APX_MEM_ERROR;
      }
      else
      {
         return APX_INTERNAL_ERROR;
      }
   }
   return APX_NO_ERROR;
}